

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O0

void cf2_glyphpath_pushMove(CF2_GlyphPath glyphpath,FT_Vector start)

{
  FT_Bool FVar1;
  FT_Pos local_68;
  CF2_CallbackParamsRec params;
  CF2_GlyphPath glyphpath_local;
  FT_Vector start_local;
  
  params.pt3.y._0_4_ = 1;
  local_68 = (glyphpath->currentDS).x;
  params.pt0.x = (glyphpath->currentDS).y;
  params._64_8_ = glyphpath;
  FVar1 = cf2_hintmap_isValid(&glyphpath->hintMap);
  if (FVar1 == '\0') {
    cf2_glyphpath_moveTo
              ((CF2_GlyphPath)params._64_8_,(CF2_F16Dot16)*(undefined8 *)(params._64_8_ + 0x4960),
               (CF2_F16Dot16)*(undefined8 *)(params._64_8_ + 0x4968));
  }
  cf2_glyphpath_hintPoint
            ((CF2_GlyphPath)params._64_8_,(CF2_HintMap)(params._64_8_ + 0x10),
             (FT_Vector *)&params.pt0.y,(CF2_F16Dot16)start.x,(CF2_F16Dot16)start.y);
  (*(code *)**(undefined8 **)(params._64_8_ + 8))(*(undefined8 *)(params._64_8_ + 8),&local_68);
  *(FT_Pos *)(params._64_8_ + 0x4950) = params.pt0.y;
  *(FT_Pos *)(params._64_8_ + 0x4958) = params.pt1.x;
  *(FT_Pos *)(params._64_8_ + 0x4920) = start.x;
  *(FT_Pos *)(params._64_8_ + 0x4928) = start.y;
  return;
}

Assistant:

static void
  cf2_glyphpath_pushMove( CF2_GlyphPath  glyphpath,
                          FT_Vector      start )
  {
    CF2_CallbackParamsRec  params;


    params.op  = CF2_PathOpMoveTo;
    params.pt0 = glyphpath->currentDS;

    /* Test if move has really happened yet; it would have called */
    /* `cf2_hintmap_build' to set `isValid'.                   */
    if ( !cf2_hintmap_isValid( &glyphpath->hintMap ) )
    {
      /* we are here iff first subpath is missing a moveto operator: */
      /* synthesize first moveTo to finish initialization of hintMap */
      cf2_glyphpath_moveTo( glyphpath,
                            glyphpath->start.x,
                            glyphpath->start.y );
    }

    cf2_glyphpath_hintPoint( glyphpath,
                             &glyphpath->hintMap,
                             &params.pt1,
                             start.x,
                             start.y );

    /* note: pt2 and pt3 are unused */
    glyphpath->callbacks->moveTo( glyphpath->callbacks, &params );

    glyphpath->currentDS    = params.pt1;
    glyphpath->offsetStart0 = start;
  }